

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ostream * smf::MidiFile::writeLittleEndianULong(ostream *out,ulong value)

{
  undefined1 local_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  anon_union_8_2_8f0da90b data;
  ulong value_local;
  ostream *out_local;
  
  local_20 = (char)value;
  std::operator<<(out,local_20);
  uStack_1f = (char)(value >> 8);
  std::operator<<(out,uStack_1f);
  uStack_1e = (char)(value >> 0x10);
  std::operator<<(out,uStack_1e);
  uStack_1d = (char)(value >> 0x18);
  std::operator<<(out,uStack_1d);
  return out;
}

Assistant:

std::ostream& MidiFile::writeLittleEndianULong(std::ostream& out, ulong value) {
	union { char bytes[4]; ulong ul; } data;
	data.ul = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}